

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::Payload<(Protocol::MQTT::Common::ControlPacketType)1>::copyInto
          (Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this,uint8 *buffer)

{
  uchar uVar1;
  uint32 uVar2;
  uint local_24;
  uint32 o;
  uint8 *buffer_local;
  Payload<(Protocol::MQTT::Common::ControlPacketType)1> *this_local;
  
  local_24 = Common::DynamicString::copyInto(&this->clientID,buffer);
  this_local._4_4_ = local_24;
  if (this->fixedHeader != (FixedField<(Protocol::MQTT::Common::ControlPacketType)1> *)0x0) {
    uVar1 = Common::BitField::operator_cast_to_unsigned_char
                      ((BitField *)
                       &(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag);
    if (uVar1 != '\0') {
      uVar2 = WillMessage::copyInto(this->willMessage,buffer + local_24);
      local_24 = uVar2 + local_24;
    }
    uVar1 = Common::BitField::operator_cast_to_unsigned_char
                      ((BitField *)
                       &(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag);
    if (uVar1 != '\0') {
      uVar2 = Common::DynamicString::copyInto(&this->username,buffer + local_24);
      local_24 = uVar2 + local_24;
    }
    uVar1 = Common::BitField::operator_cast_to_unsigned_char
                      ((BitField *)
                       &(this->fixedHeader->super_ConnectHeaderImpl).field_2.usernameFlag);
    if (uVar1 != '\0') {
      uVar2 = Common::DynamicBinaryData::copyInto(&this->password,buffer + local_24);
      local_24 = uVar2 + local_24;
    }
    this_local._4_4_ = local_24;
  }
  return this_local._4_4_;
}

Assistant:

uint32 copyInto(uint8 * buffer) const
                {
                    uint32 o = clientID.copyInto(buffer);
                    if (!fixedHeader) return o;
                    if (fixedHeader->willFlag)       o += willMessage->copyInto(buffer+o);
                    if (fixedHeader->usernameFlag)   o += username.copyInto(buffer+o);
                    if (fixedHeader->passwordFlag)   o += password.copyInto(buffer+o);
                    return o;
                }